

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_list.cxx
# Opt level: O1

void fl_filename_free_list(dirent ***list,int n)

{
  ulong uVar1;
  
  if (-1 < n) {
    if (n != 0) {
      uVar1 = 0;
      do {
        if ((*list)[uVar1] != (dirent *)0x0) {
          free((*list)[uVar1]);
        }
        uVar1 = uVar1 + 1;
      } while ((uint)n != uVar1);
    }
    free(*list);
    *list = (dirent **)0x0;
  }
  return;
}

Assistant:

void fl_filename_free_list(struct dirent ***list, int n)
{
  if (n<0) return;
  
  int i;
  for (i = 0; i < n; i ++) {
    if ((*list)[i])
      free((*list)[i]);
  }  
  free(*list);
  *list = 0;
}